

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O3

void * kmemmem(void *_str,int n,void *_pat,int m,int **_prep)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  undefined1 auVar5 [16];
  int *__ptr;
  int *piVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  size_t __nmemb;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar21;
  
  if ((_prep == (int **)0x0) || (__ptr = *_prep, __ptr == (int *)0x0)) {
    __ptr = (int *)calloc((long)(m + 0x100),4);
    __nmemb = (size_t)m;
    lVar8 = 0;
    do {
      piVar6 = __ptr + __nmemb + lVar8;
      *piVar6 = m;
      piVar6[1] = m;
      piVar6[2] = m;
      piVar6[3] = m;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x100);
    uVar1 = m - 1;
    uVar17 = (ulong)uVar1;
    uVar18 = (ulong)uVar1;
    pbVar9 = (byte *)_pat;
    uVar11 = uVar18;
    if (m < 2) {
      piVar6 = (int *)calloc(__nmemb,4);
      piVar6[(int)uVar1] = m;
    }
    else {
      do {
        __ptr[__nmemb + *pbVar9] = (int)uVar11;
        uVar11 = uVar11 - 1;
        pbVar9 = pbVar9 + 1;
      } while (uVar11 != 0);
      piVar6 = (int *)calloc(__nmemb,4);
      piVar6[(int)uVar1] = m;
      uVar14 = 0;
      uVar11 = (ulong)(m - 2);
      do {
        iVar12 = (int)uVar17;
        uVar13 = (ulong)iVar12;
        uVar7 = (uint)uVar11;
        if (((long)uVar11 <= (long)uVar13) ||
           (iVar15 = piVar6[(int)(~uVar14 + uVar7 + m)], (int)(uVar7 - iVar12) <= iVar15)) {
          if ((int)uVar7 < iVar12) {
            uVar17 = uVar11 & 0xffffffff;
          }
          if (-1 < (int)uVar17) {
            if ((long)uVar11 < (long)uVar13) {
              uVar13 = uVar11;
            }
            do {
              if (*(char *)((long)_pat + uVar13) !=
                  *(char *)((long)_pat + (long)(int)(((m + -1) - uVar7) + (int)uVar13))) {
                uVar17 = uVar13 & 0xffffffff;
                goto LAB_0013759d;
              }
              bVar3 = 0 < (long)uVar13;
              uVar13 = uVar13 - 1;
            } while (bVar3);
            uVar17 = 0xffffffff;
          }
LAB_0013759d:
          iVar15 = uVar7 - (int)uVar17;
          uVar14 = uVar7;
        }
        piVar6[uVar11] = iVar15;
        bVar3 = 0 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar3);
    }
    auVar5 = _DAT_001567e0;
    if (0 < m) {
      lVar8 = (ulong)(uint)m - 1;
      auVar19._8_4_ = (int)lVar8;
      auVar19._0_8_ = lVar8;
      auVar19._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar19 = auVar19 ^ _DAT_001567e0;
      auVar20 = _DAT_001567c0;
      auVar22 = _DAT_001567d0;
      do {
        auVar23 = auVar22 ^ auVar5;
        iVar12 = auVar19._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar12 && auVar19._0_4_ < auVar23._0_4_ ||
                    iVar12 < auVar23._4_4_) & 1)) {
          *(int *)((long)__ptr + lVar8) = m;
        }
        if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
            auVar23._12_4_ <= auVar19._12_4_) {
          *(int *)((long)__ptr + lVar8 + 4) = m;
        }
        auVar23 = auVar20 ^ auVar5;
        iVar15 = auVar23._4_4_;
        if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar23._0_4_ <= auVar19._0_4_)) {
          *(int *)((long)__ptr + lVar8 + 8) = m;
          *(int *)((long)__ptr + lVar8 + 0xc) = m;
        }
        lVar21 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar21 + 4;
        lVar21 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar21 + 4;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(m + 3U >> 2) << 4 != lVar8);
      uVar17 = 0;
      iVar12 = 0;
      uVar11 = uVar18;
      do {
        if (uVar11 + 1 == (ulong)(uint)piVar6[uVar11]) {
          uVar13 = (ulong)iVar12;
          if ((long)uVar13 < (long)(uVar18 - uVar11)) {
            do {
              if (__ptr[uVar13] == m) {
                __ptr[uVar13] = (int)(uVar18 - uVar11);
              }
              uVar13 = uVar13 + 1;
            } while (uVar17 != uVar13);
            iVar12 = (int)uVar17;
          }
        }
        uVar11 = uVar11 - 1;
        uVar17 = uVar17 + 1;
      } while (uVar17 != (uint)m);
      piVar10 = piVar6;
      if (m != 1) {
        do {
          __ptr[(long)(int)uVar1 - (long)*piVar10] = (int)uVar18;
          uVar18 = uVar18 - 1;
          piVar10 = piVar10 + 1;
        } while (uVar18 != 0);
      }
    }
    free(piVar6);
    if ((_prep != (int **)0x0) && (*_prep == (int *)0x0)) {
      *_prep = __ptr;
    }
  }
  if (-1 < n - m) {
    iVar12 = 0;
    do {
      lVar8 = (long)m;
      iVar15 = 1;
      do {
        if (lVar8 < 1) {
          return (void *)((long)_str + (long)iVar12);
        }
        lVar21 = lVar8 + -1;
        bVar2 = *(byte *)((long)_str + lVar8 + (long)iVar12 + -1);
        iVar15 = iVar15 + -1;
        lVar4 = lVar8 + -1;
        lVar8 = lVar21;
      } while (*(byte *)((long)_pat + lVar4) == bVar2);
      iVar16 = iVar15 + __ptr[(long)m + (ulong)bVar2];
      if (iVar15 + __ptr[(long)m + (ulong)bVar2] <= __ptr[lVar21]) {
        iVar16 = __ptr[lVar21];
      }
      iVar12 = iVar12 + iVar16;
    } while (iVar12 <= n - m);
  }
  if (_prep == (int **)0x0) {
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void *kmemmem(const void *_str, int n, const void *_pat, int m, int **_prep)
{
	int i, j, *prep = 0, *bmGs, *bmBc;
	const ubyte_t *str, *pat;
	str = (const ubyte_t*)_str; pat = (const ubyte_t*)_pat;
	prep = (_prep == 0 || *_prep == 0)? ksBM_prep(pat, m) : *_prep;
	if (_prep && *_prep == 0) *_prep = prep;
	bmGs = prep; bmBc = prep + m;
	j = 0;
	while (j <= n - m) {
		for (i = m - 1; i >= 0 && pat[i] == str[i+j]; --i);
		if (i >= 0) {
			int max = bmBc[str[i+j]] - m + 1 + i;
			if (max < bmGs[i]) max = bmGs[i];
			j += max;
		} else return (void*)(str + j);
	}
	if (_prep == 0) free(prep);
	return 0;
}